

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

HairMaterial *
pbrt::HairMaterial::Create(TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  uintptr_t iptr_1;
  HairMaterial *pHVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *message;
  uintptr_t iptr;
  allocator<char> local_99;
  RGBSpectrum local_98;
  FloatTextureHandle pheomelanin;
  FloatTextureHandle eumelanin;
  SpectrumTextureHandle color;
  SpectrumTextureHandle sigma_a;
  FloatTextureHandle eta;
  FloatTextureHandle alpha;
  FloatTextureHandle beta_n;
  FloatTextureHandle beta_m;
  Allocator alloc_local;
  undefined8 *puVar3;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"sigma_a",(allocator<char> *)&color);
  TextureParameterDictionary::GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)&sigma_a,(string *)parameters,(SpectrumType)&local_98,
             (Allocator)0x1);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"color",(allocator<char> *)&eumelanin);
  TextureParameterDictionary::GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)&color,(string *)parameters,(SpectrumType)&local_98,
             (Allocator)0x0);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"eumelanin",(allocator<char> *)&pheomelanin);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&eumelanin,(string *)parameters,
             (memory_resource *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"pheomelanin",(allocator<char> *)&eta);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&pheomelanin,(string *)parameters,
             (memory_resource *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if (((ulong)sigma_a.
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits & 0xffffffffffff) == 0) {
    if (((ulong)color.
                super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                .bits & 0xffffffffffff) == 0) {
      if ((((ulong)eumelanin.
                   super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                   .bits & 0xffffffffffff) == 0) &&
         (((ulong)pheomelanin.
                  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                  .bits & 0xffffffffffff) == 0)) {
        HairBxDF::SigmaAFromConcentration(&local_98,1.3,0.0);
        iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
        puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar1);
        *puVar3 = local_98.rgb._0_8_;
        puVar3[1] = local_98._8_8_;
        puVar3[2] = local_98.rsp._0_8_;
        puVar3[3] = local_98._24_8_;
        puVar3[4] = local_98.illuminant;
        iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,8);
        sigma_a.
        super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
        .bits = (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                 )(CONCAT44(extraout_var_00,iVar1) | 0x7000000000000);
        *(ulong *)CONCAT44(extraout_var_00,iVar1) = (ulong)puVar3 | 0x4000000000000;
      }
      goto LAB_003b0731;
    }
    if (((ulong)eumelanin.
                super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                .bits & 0xffffffffffff) != 0) {
      Warning(loc,"Ignoring \"eumelanin\" parameter since \"color\" was provided.");
    }
    if (((ulong)pheomelanin.
                super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                .bits & 0xffffffffffff) == 0) goto LAB_003b0731;
    message = "Ignoring \"pheomelanin\" parameter since \"color\" was provided.";
  }
  else {
    if (((ulong)color.
                super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                .bits & 0xffffffffffff) != 0) {
      Warning(loc,"Ignoring \"color\" parameter since \"sigma_a\" was provided.");
    }
    if (((ulong)eumelanin.
                super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                .bits & 0xffffffffffff) != 0) {
      Warning(loc,"Ignoring \"eumelanin\" parameter since \"sigma_a\" was provided.");
    }
    if (((ulong)pheomelanin.
                super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                .bits & 0xffffffffffff) == 0) goto LAB_003b0731;
    message = "Ignoring \"pheomelanin\" parameter since \"sigma_a\" was provided.";
  }
  Warning(loc,message);
LAB_003b0731:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"eta",(allocator<char> *)&beta_m);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&eta,(string *)parameters,1.55,
             (memory_resource *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"beta_m",(allocator<char> *)&beta_n);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&beta_m,(string *)parameters,0.3,
             (memory_resource *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"beta_n",(allocator<char> *)&alpha);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&beta_n,(string *)parameters,0.3,
             (memory_resource *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"alpha",&local_99);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&alpha,(string *)parameters,2.0,
             (memory_resource *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  pHVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::HairMaterial,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&>
                     (&alloc_local,&sigma_a,&color,&eumelanin,&pheomelanin,&eta,&beta_m,&beta_n,
                      &alpha);
  return pHVar2;
}

Assistant:

HairMaterial *HairMaterial::Create(const TextureParameterDictionary &parameters,
                                   const FileLoc *loc, Allocator alloc) {
    SpectrumTextureHandle sigma_a =
        parameters.GetSpectrumTextureOrNull("sigma_a", SpectrumType::General, alloc);
    SpectrumTextureHandle color =
        parameters.GetSpectrumTextureOrNull("color", SpectrumType::Reflectance, alloc);
    FloatTextureHandle eumelanin = parameters.GetFloatTextureOrNull("eumelanin", alloc);
    FloatTextureHandle pheomelanin =
        parameters.GetFloatTextureOrNull("pheomelanin", alloc);
    if (sigma_a) {
        if (color)
            Warning(loc, R"(Ignoring "color" parameter since "sigma_a" was provided.)");
        if (eumelanin)
            Warning(loc, "Ignoring \"eumelanin\" parameter since \"sigma_a\" was "
                         "provided.");
        if (pheomelanin)
            Warning(loc, "Ignoring \"pheomelanin\" parameter since \"sigma_a\" was "
                         "provided.");
    } else if (color) {
        if (sigma_a)
            Warning(loc, R"(Ignoring "sigma_a" parameter since "color" was provided.)");
        if (eumelanin)
            Warning(loc, "Ignoring \"eumelanin\" parameter since \"color\" was "
                         "provided.");
        if (pheomelanin)
            Warning(loc, "Ignoring \"pheomelanin\" parameter since \"color\" was "
                         "provided.");
    } else if (eumelanin || pheomelanin) {
        if (sigma_a)
            Warning(loc, "Ignoring \"sigma_a\" parameter since "
                         "\"eumelanin\"/\"pheomelanin\" was provided.");
        if (color)
            Warning(loc, "Ignoring \"color\" parameter since "
                         "\"eumelanin\"/\"pheomelanin\" was provided.");
    } else {
        // Default: brown-ish hair.
        sigma_a = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<RGBSpectrum>(HairBxDF::SigmaAFromConcentration(1.3, 0.)));
    }

    FloatTextureHandle eta = parameters.GetFloatTexture("eta", 1.55f, alloc);
    FloatTextureHandle beta_m = parameters.GetFloatTexture("beta_m", 0.3f, alloc);
    FloatTextureHandle beta_n = parameters.GetFloatTexture("beta_n", 0.3f, alloc);
    FloatTextureHandle alpha = parameters.GetFloatTexture("alpha", 2.f, alloc);

    return alloc.new_object<HairMaterial>(sigma_a, color, eumelanin, pheomelanin, eta,
                                          beta_m, beta_n, alpha);
}